

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_init(filemgr *file,int nbucket)

{
  undefined2 uVar1;
  wal *pwVar2;
  filemgr_config *pfVar3;
  uint uVar4;
  wal_shard *pwVar5;
  wal_shard *pwVar6;
  ushort uVar7;
  ulong uVar8;
  
  LOCK();
  (file->wal->isPopulated).super___atomic_base<unsigned_char>._M_i = '\0';
  UNLOCK();
  pwVar2 = file->wal;
  pwVar2->flag = '\x01';
  LOCK();
  (pwVar2->size).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->num_flushable).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->datasize).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->mem_overhead).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pwVar6 = (wal_shard *)0x0;
  pwVar2 = file->wal;
  (pwVar2->txn_list).head = (list_elem *)0x0;
  (pwVar2->txn_list).tail = (list_elem *)0x0;
  pwVar2->wal_dirty = '\0';
  pthread_spin_init(&file->wal->lock,1);
  pfVar3 = file->config;
  uVar1 = pfVar3->num_wal_shards;
  uVar7 = 0xb;
  if (uVar1 != 0) {
    uVar7 = uVar1;
  }
  pwVar2 = file->wal;
  uVar8 = (ulong)uVar7;
  pwVar2->num_shards = uVar8;
  pwVar5 = (wal_shard *)malloc(uVar8 * 0x18);
  pwVar2->key_shards = pwVar5;
  if (pfVar3->seqtree_opt == '\x01') {
    pwVar6 = (wal_shard *)malloc(uVar8 * 0x18);
  }
  pwVar2->seq_shards = pwVar6;
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((int)(uint)uVar8 < 0) break;
    uVar4 = (uint)uVar8 & 0x7fffffff;
    avl_init(&file->wal->key_shards[uVar4]._map,(void *)0x0);
    pthread_spin_init(&file->wal->key_shards[uVar4].lock,1);
    if (file->config->seqtree_opt == '\x01') {
      avl_init(&file->wal->seq_shards[uVar4]._map,(void *)0x0);
      pthread_spin_init(&file->wal->seq_shards[uVar4].lock,1);
    }
  }
  avl_init(&file->wal->wal_snapshot_tree,(void *)0x0);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_init(struct filemgr *file, int nbucket)
{
    size_t num_shards;
    atomic_init_uint8_t(&file->wal->isPopulated, 0);
    file->wal->flag = WAL_FLAG_INITIALIZED;
    atomic_init_uint32_t(&file->wal->size, 0);
    atomic_init_uint32_t(&file->wal->num_flushable, 0);
    atomic_init_uint64_t(&file->wal->datasize, 0);
    atomic_init_uint64_t(&file->wal->mem_overhead, 0);
    file->wal->wal_dirty = FDB_WAL_CLEAN;

    list_init(&file->wal->txn_list);
    spin_init(&file->wal->lock);

    if (file->config->num_wal_shards) {
        file->wal->num_shards = file->config->num_wal_shards;
    } else {
        file->wal->num_shards = DEFAULT_NUM_WAL_PARTITIONS;
    }

    num_shards = wal_get_num_shards(file);
    file->wal->key_shards = (wal_shard *)
        malloc(sizeof(struct wal_shard) * num_shards);

    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
        file->wal->seq_shards = (wal_shard *)
            malloc(sizeof(struct wal_shard) * num_shards);
    } else {
        file->wal->seq_shards = NULL;
    }

    for (int i = num_shards - 1; i >= 0; --i) {
        avl_init(&file->wal->key_shards[i]._map, NULL);
        spin_init(&file->wal->key_shards[i].lock);
        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            avl_init(&file->wal->seq_shards[i]._map, NULL);
            spin_init(&file->wal->seq_shards[i].lock);
        }
    }

    avl_init(&file->wal->wal_snapshot_tree, NULL);

    DBG("wal item size %ld\n", sizeof(struct wal_item));
    return FDB_RESULT_SUCCESS;
}